

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O1

RunResult __thiscall wabt::interp::Thread::PushCall(Thread *this,HostFunc *func,Ptr *out_trap)

{
  Store *this_00;
  RunResult RVar1;
  int local_6c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  RefPtr<wabt::interp::Trap> local_48;
  
  if ((this->frames_).super__Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>.
      _M_impl.super__Vector_impl_data._M_finish ==
      (this->frames_).super__Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    this_00 = this->store_;
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"call stack exhausted","");
    Store::
    Alloc<wabt::interp::Trap,wabt::interp::Store&,std::__cxx11::string_const&,std::vector<wabt::interp::Frame,std::allocator<wabt::interp::Frame>>const&>
              (&local_48,this_00,this_00,&local_68,&this->frames_);
    out_trap->obj_ = local_48.obj_;
    out_trap->store_ = local_48.store_;
    out_trap->root_index_ = local_48.root_index_;
    local_48.obj_ = (Trap *)0x0;
    local_48.store_ = (Store *)0x0;
    local_48.root_index_ = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p);
    }
    RVar1 = Trap;
  }
  else {
    this->inst_ = (Instance *)0x0;
    this->mod_ = (Module *)0x0;
    local_68._M_dataplus._M_p = (pointer)(func->super_Func).super_Extern.super_Object.self_.index;
    local_48.obj_ =
         (Trap *)(((long)(this->values_).
                         super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(this->values_).
                         super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555);
    local_6c = 0;
    std::vector<wabt::interp::Frame,std::allocator<wabt::interp::Frame>>::
    emplace_back<wabt::interp::Ref,unsigned_long,int,wabt::interp::Instance*&,wabt::interp::Module*&>
              ((vector<wabt::interp::Frame,std::allocator<wabt::interp::Frame>> *)&this->frames_,
               (Ref *)&local_68,(unsigned_long *)&local_48,&local_6c,&this->inst_,&this->mod_);
    RVar1 = Ok;
  }
  return RVar1;
}

Assistant:

RunResult Thread::PushCall(const HostFunc& func, Trap::Ptr* out_trap) {
  TRAP_IF(frames_.size() == frames_.capacity(), "call stack exhausted");
  inst_ = nullptr;
  mod_ = nullptr;
  frames_.emplace_back(func.self(), values_.size(), 0, inst_, mod_);
  return RunResult::Ok;
}